

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVector<slang::SmallVector<int,_10UL>,_2UL>::SmallVector
          (SmallVector<slang::SmallVector<int,_10UL>,_2UL> *this,Base *other)

{
  move_iterator<slang::SmallVector<int,_10UL>_*> first;
  size_type sVar1;
  
  (this->super_SmallVectorBase<slang::SmallVector<int,_10UL>_>).data_ =
       (pointer)(this->super_SmallVectorBase<slang::SmallVector<int,_10UL>_>).firstElement;
  (this->super_SmallVectorBase<slang::SmallVector<int,_10UL>_>).len = 0;
  (this->super_SmallVectorBase<slang::SmallVector<int,_10UL>_>).cap = 0;
  first._M_current = other->data_;
  if (first._M_current != (SmallVector<int,_10UL> *)other->firstElement) {
    other->data_ = (pointer)0x0;
    (this->super_SmallVectorBase<slang::SmallVector<int,_10UL>_>).data_ = first._M_current;
    sVar1 = other->len;
    other->len = 0;
    (this->super_SmallVectorBase<slang::SmallVector<int,_10UL>_>).len = sVar1;
    sVar1 = other->cap;
    other->cap = 0;
    (this->super_SmallVectorBase<slang::SmallVector<int,_10UL>_>).cap = sVar1;
    return;
  }
  (this->super_SmallVectorBase<slang::SmallVector<int,_10UL>_>).cap = 2;
  SmallVectorBase<slang::SmallVector<int,_10UL>_>::
  append<std::move_iterator<slang::SmallVector<int,_10UL>_*>_>
            (&this->super_SmallVectorBase<slang::SmallVector<int,_10UL>_>,first,
             first._M_current + other->len);
  SmallVectorBase<slang::SmallVector<int,_10UL>_>::clear(other);
  return;
}

Assistant:

SmallVector(Base&& other) noexcept {
        if (other.isSmall()) {
            this->cap = N;
            this->append(std::make_move_iterator(other.begin()),
                         std::make_move_iterator(other.end()));
            other.clear();
        }
        else {
            this->data_ = std::exchange(other.data_, nullptr);
            this->len = std::exchange(other.len, 0);
            this->cap = std::exchange(other.cap, 0);
        }
    }